

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::ConsumeInteger(Parser *this,int *output,ErrorMaker error)

{
  ErrorMaker error_00;
  bool bVar1;
  int iVar2;
  Token *pTVar3;
  ErrorMaker local_48;
  uint64_t local_38;
  uint64_t value;
  int *output_local;
  Parser *this_local;
  ErrorMaker error_local;
  
  error_local.field_0 = (anon_union_8_2_7976e4ae_for_ErrorMaker_0)error.func_;
  this_local = (Parser *)error.field_0;
  value = (uint64_t)output;
  output_local = (int *)this;
  bVar1 = LookingAtType(this,TYPE_INTEGER);
  if (bVar1) {
    local_38 = 0;
    pTVar3 = io::Tokenizer::current(this->input_);
    iVar2 = std::numeric_limits<int>::max();
    bVar1 = io::Tokenizer::ParseInteger(&pTVar3->text,(long)iVar2,&local_38);
    if (!bVar1) {
      ErrorMaker::ErrorMaker(&local_48,"Integer out of range.");
      RecordError(this,local_48);
    }
    *(int *)value = (int)local_38;
    io::Tokenizer::Next(this->input_);
    error_local.func_._7_1_ = true;
  }
  else {
    error_00.func_ = (_func_string_void_ptr *)error_local.field_0.error_;
    error_00.field_0.error_ = (char *)this_local;
    RecordError(this,error_00);
    error_local.func_._7_1_ = false;
  }
  return error_local.func_._7_1_;
}

Assistant:

bool Parser::ConsumeInteger(int* output, ErrorMaker error) {
  if (LookingAtType(io::Tokenizer::TYPE_INTEGER)) {
    uint64_t value = 0;
    if (!io::Tokenizer::ParseInteger(input_->current().text,
                                     std::numeric_limits<int32_t>::max(),
                                     &value)) {
      RecordError("Integer out of range.");
      // We still return true because we did, in fact, parse an integer.
    }
    *output = value;
    input_->Next();
    return true;
  } else {
    RecordError(error);
    return false;
  }
}